

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O2

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_manual_::run(Test_intlog_log2floor_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  string_view msg;
  string_view msg_00;
  uint local_100;
  uint local_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_48;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_28;
  
  local_fc = log2floor_fast<unsigned_int>(0);
  local_100 = 0;
  if (local_fc != 0) {
    stringify<unsigned_int>(&local_28,&local_fc);
    std::operator+(&local_a8,
                   "Comparison failed: log2floor_fast(0u) == 0u (with \"log2floor_fast(0u)\"=",
                   &local_28);
    std::operator+(&local_88,&local_a8,", \"0u\"=");
    stringify<unsigned_int>(&local_48,&local_100);
    std::operator+(&local_68,&local_88,&local_48);
    std::operator+(&local_f8,&local_68,")");
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    pcStack_b8 = "run";
    local_b0 = 0x5e;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
    loc.line = 0x5e;
    msg._M_str = local_f8._M_dataplus._M_p;
    msg._M_len = local_f8._M_string_length;
    assertFail(msg,loc);
  }
  local_fc = log2floor_naive<unsigned_int>(0);
  local_100 = 0;
  if (local_fc == 0) {
    return;
  }
  stringify<unsigned_int>(&local_28,&local_fc);
  std::operator+(&local_a8,
                 "Comparison failed: log2floor_naive(0u) == 0u (with \"log2floor_naive(0u)\"=",
                 &local_28);
  std::operator+(&local_88,&local_a8,", \"0u\"=");
  stringify<unsigned_int>(&local_48,&local_100);
  std::operator+(&local_68,&local_88,&local_48);
  std::operator+(&local_f8,&local_68,")");
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  pcStack_d0 = "run";
  local_c8 = 0x5f;
  loc_00.function = "run";
  loc_00.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_intlog.cpp";
  loc_00.line = 0x5f;
  msg_00._M_str = local_f8._M_dataplus._M_p;
  msg_00._M_len = local_f8._M_string_length;
  assertFail(msg_00,loc_00);
}

Assistant:

BITMANIP_TEST(intlog, log2floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log2floor(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_debruijn(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_fast(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_naive(0u), 0u);
}